

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O3

void __thiscall
PathTracerViewer::create_main_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::RenderPass> *render_pass,uint32_t subpass)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 this_00;
  _func_int **pp_Var4;
  element_type *peVar5;
  int iVar6;
  undefined4 extraout_var;
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_00;
  initializer_list<VkVertexInputBindingDescription> __l_01;
  initializer_list<VkVertexInputAttributeDescription> __l_02;
  initializer_list<VkDynamicState> __l_03;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  shared_ptr<myvk::Device> device;
  uint32_t kPathTracerViewerMainFragSpirv [145];
  uint32_t kPathTracerViewerMainVertSpirv [246];
  allocator_type local_97a;
  allocator_type local_979;
  undefined1 local_978 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_950;
  element_type *local_948;
  Ptr<Device> local_940;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  local_930;
  VkVertexInputAttributeDescription local_918;
  undefined1 local_908 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  element_type *local_8f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8e8;
  VkSpecializationInfo *local_8e0;
  undefined1 auStack_8d8 [16];
  VertexInputState local_8c8;
  InputAssemblyState local_860;
  VkStructureType local_838;
  void *local_830;
  undefined8 uStack_828;
  bool local_820;
  ViewportState local_818;
  MultisampleState local_7b0;
  VkStructureType local_778;
  void *local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 local_750 [32];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  bool local_710;
  ColorBlendState local_708;
  DynamicState local_6b0;
  VkVertexInputBindingDescription local_664;
  PipelineLayout local_658 [8];
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  local_408 [41];
  
  iVar6 = (*(((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)CONCAT44(extraout_var,iVar6);
  local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((undefined8 *)CONCAT44(extraout_var,iVar6))[1];
  if (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_978._32_8_ =
       (this->m_descriptor_set_layout).
       super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_950 = (this->m_descriptor_set_layout).
              super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (local_950 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_950->_M_use_count = local_950->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_950->_M_use_count = local_950->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)(local_978 + 0x20);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector(local_408,__l,(allocator_type *)local_978);
  local_908._0_8_ = (ShaderModule *)0x0;
  local_908._8_8_ = (element_type *)0x0;
  local_8f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::PipelineLayout::Create
            (local_658,&local_940,local_408,
             (vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)local_908);
  peVar5 = local_658[0].super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_Var4 = local_658[0].super_DeviceObjectBase.super_Base._vptr_Base;
  local_658[0].super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
  local_658[0].super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
  _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var1 = (this->m_main_pipeline_layout).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_main_pipeline_layout).
  super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var4;
  (this->m_main_pipeline_layout).
  super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (local_658[0].super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
        _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_658[0].super_DeviceObjectBase.super_Base.
                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  if ((ShaderModule *)local_908._0_8_ != (ShaderModule *)0x0) {
    operator_delete((void *)local_908._0_8_,(long)local_8f8._M_pi - local_908._0_8_);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(local_408);
  if (local_950 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_950);
  }
  memcpy(local_408,&DAT_00274830,0x3d8);
  memcpy(local_658,&DAT_00274c10,0x244);
  myvk::ShaderModule::Create((ShaderModule *)local_908,&local_940,(uint32_t *)local_408,0x3d8);
  uVar2 = local_908._0_8_;
  local_978._24_8_ = local_908._8_8_;
  myvk::ShaderModule::Create((ShaderModule *)local_908,&local_940,(uint32_t *)local_658,0x244);
  this_00 = local_908._8_8_;
  uVar3 = local_908._0_8_;
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_908,(ShaderModule *)uVar2,
             VK_SHADER_STAGE_VERTEX_BIT,(VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_8d8,(ShaderModule *)uVar3,
             VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_908;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)(local_978 + 0x20),__l_00,(allocator_type *)local_978);
  local_908._0_4_ = 0x17;
  local_908._8_8_ = (element_type *)0x0;
  local_8f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8f0 = (element_type *)0x0;
  _Stack_8e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_8e0 = (VkSpecializationInfo *)0x0;
  auStack_8d8._0_8_ = 0;
  auStack_8d8._8_4_ = 0.0;
  local_8c8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c8.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_8c8.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_8c8.m_enable = false;
  local_8c8.m_create_info.pNext = (void *)0x0;
  local_8c8.m_create_info.flags = 0;
  local_8c8.m_create_info.vertexBindingDescriptionCount = 0;
  local_8c8.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_8c8.m_create_info._28_8_ = 0;
  local_860.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_860.m_enable = false;
  local_860.m_create_info.pNext = (void *)0x0;
  local_860.m_create_info.flags = 0;
  local_860.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_860.m_create_info.primitiveRestartEnable = 0;
  local_838 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_820 = false;
  local_830 = (void *)0x0;
  uStack_828._0_4_ = 0;
  uStack_828._4_4_ = 0;
  local_818.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_818.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_818.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_818.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_818.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_818.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_818.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_818.m_create_info.pScissors = (VkRect2D *)0x0;
  local_818.m_enable = false;
  local_818.m_create_info.pNext = (void *)0x0;
  local_818.m_create_info.flags = 0;
  local_818.m_create_info.viewportCount = 0;
  local_818.m_create_info.pViewports._0_4_ = 0;
  local_818.m_create_info._28_8_ = 0;
  local_7b0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_7b0.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_7b0._41_8_ = 0;
  local_7b0.m_create_info.sampleShadingEnable = 0;
  local_7b0.m_create_info.minSampleShading = 0.0;
  local_7b0.m_create_info.pSampleMask._0_1_ = 0;
  local_7b0.m_create_info.pSampleMask._1_7_ = 0;
  local_7b0.m_create_info.pNext = (void *)0x0;
  local_7b0.m_create_info.flags = 0;
  local_7b0.m_create_info.rasterizationSamples = 0;
  local_778 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_770 = (void *)0x0;
  uStack_768._0_4_ = 0;
  uStack_768._4_4_ = 0;
  local_760._0_4_ = 0;
  local_760._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_758._0_4_ = 0;
  uStack_758._4_4_ = 0;
  local_750._0_4_ = VK_STENCIL_OP_KEEP;
  local_750._4_4_ = VK_STENCIL_OP_KEEP;
  local_750._8_4_ = VK_STENCIL_OP_KEEP;
  local_750._12_4_ = VK_COMPARE_OP_NEVER;
  local_750._16_4_ = 0;
  local_750._20_4_ = 0;
  local_750._24_4_ = 0;
  local_750._28_4_ = VK_STENCIL_OP_KEEP;
  local_730._0_4_ = VK_STENCIL_OP_KEEP;
  local_730._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_728._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_728._4_4_ = 0;
  local_720._0_4_ = 0;
  local_720._4_4_ = 0;
  uStack_718._0_4_ = 0.0;
  uStack_718._4_4_ = 0.0;
  local_710 = false;
  local_708.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_708.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_708.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_708.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_708.m_enable = false;
  local_708.m_create_info.blendConstants[0] = 0.0;
  local_708.m_create_info.blendConstants[1] = 0.0;
  local_708.m_create_info.blendConstants[2] = 0.0;
  local_708.m_create_info.blendConstants[3] = 0.0;
  local_708.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_708.m_create_info.attachmentCount = 0;
  local_708.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_708.m_create_info.pNext = (void *)0x0;
  local_708.m_create_info.flags = 0;
  local_708.m_create_info.logicOpEnable = 0;
  local_6b0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6b0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6b0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_6b0.m_create_info.pDynamicStates._0_1_ = 0;
  local_6b0._49_8_ = 0;
  local_6b0.m_create_info.pNext = (void *)0x0;
  local_6b0.m_create_info.flags._0_1_ = 0;
  local_6b0.m_create_info._17_7_ = 0;
  local_664.binding = 0;
  local_664.stride = 8;
  local_664.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  __l_01._M_len = 1;
  __l_01._M_array = &local_664;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)local_978,__l_01,&local_979);
  local_918.location = 0;
  local_918.binding = 0;
  local_918.format = VK_FORMAT_R32G32_SFLOAT;
  local_918.offset = 0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_918;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector(&local_930,__l_02,&local_97a);
  myvk::GraphicsPipelineState::VertexInputState::Enable
            (&local_8c8,
             (vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
              *)local_978,&local_930);
  if (local_930.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_930.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_930.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_930.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)local_978._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ - local_978._0_8_);
  }
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_860,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_818,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_908,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1)
  ;
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_7b0,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_708,1,0);
  local_930.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000000;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_930;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_978,__l_03,
             (allocator_type *)&local_918);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_6b0,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_978);
  if ((element_type *)local_978._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_978._0_8_,local_978._16_8_ - local_978._0_8_);
  }
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_978,&this->m_main_pipeline_layout,render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)(local_978 + 0x20),(GraphicsPipelineState *)local_908,subpass);
  uVar3 = local_978._8_8_;
  uVar2 = local_978._0_8_;
  local_978._0_8_ = (pointer)0x0;
  local_978._8_8_ = (element_type *)0x0;
  p_Var1 = (this->m_main_graphics_pipeline).
           super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_main_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_main_graphics_pipeline).
  super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((element_type *)local_978._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_978._8_8_);
    }
  }
  if (local_6b0.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.m_dynamic_states.
                    super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b0.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b0.m_dynamic_states.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_708.m_color_blend_attachments.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_708.m_color_blend_attachments.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_708.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_708.m_color_blend_attachments.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_818.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_818.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_818.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_818.m_scissors.
                          super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_818.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_818.m_viewports.
                    super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_818.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_818.m_viewports.
                          super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((VkSpecializationInfo *)
      local_8c8.m_attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (VkSpecializationInfo *)0x0) {
    operator_delete(local_8c8.m_attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8c8.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c8.m_attributes.
                          super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_8c8.m_bindings.
      super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8c8.m_bindings.
                    super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8c8.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c8.m_bindings.
                          super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((element_type *)local_978._32_8_ != (element_type *)0x0) {
    operator_delete((void *)local_978._32_8_,(long)local_948 - local_978._32_8_);
  }
  if ((element_type *)this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if ((element_type *)local_978._24_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_978._24_8_);
  }
  if (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_940.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void PathTracerViewer::create_main_graphics_pipeline(const std::shared_ptr<myvk::RenderPass> &render_pass,
                                                     uint32_t subpass) {
	std::shared_ptr<myvk::Device> device = render_pass->GetDevicePtr();

	m_main_pipeline_layout = myvk::PipelineLayout::Create(device, {m_descriptor_set_layout}, {});

	constexpr uint32_t kPathTracerViewerMainVertSpirv[] = {
#include "spirv/path_tracer_viewer_main.vert.u32"
	};
	constexpr uint32_t kPathTracerViewerMainFragSpirv[] = {
#include "spirv/path_tracer_viewer_main.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerMainVertSpirv, sizeof(kPathTracerViewerMainVertSpirv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerMainFragSpirv, sizeof(kPathTracerViewerMainFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	VkVertexInputBindingDescription binding_descriptor = {};
	binding_descriptor.binding = 0;
	binding_descriptor.stride = sizeof(float) * 2;
	binding_descriptor.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;

	VkVertexInputAttributeDescription attribute_description = {};
	attribute_description.binding = 0;
	attribute_description.location = 0;
	attribute_description.format = VK_FORMAT_R32G32_SFLOAT;
	attribute_description.offset = 0;

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable({binding_descriptor}, {attribute_description});
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_main_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_main_pipeline_layout, render_pass, shader_stages, pipeline_state, subpass);
}